

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberHex(UNITY_UINT number,char nibbles_to_print)

{
  uint uVar1;
  undefined3 in_register_00000031;
  int __c;
  byte bVar2;
  char cVar3;
  
  cVar3 = '\x10';
  if (CONCAT31(in_register_00000031,nibbles_to_print) < 0x11) {
    cVar3 = nibbles_to_print;
  }
  bVar2 = cVar3 * '\x04';
  while( true ) {
    bVar2 = bVar2 - 4;
    if (cVar3 < '\x01') break;
    uVar1 = (uint)(number >> (bVar2 & 0x3f)) & 0xf;
    __c = uVar1 + 0x30;
    if (9 < uVar1) {
      __c = uVar1 + 0x37;
    }
    putchar(__c);
    cVar3 = cVar3 + -1;
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const UNITY_UINT number, const char nibbles_to_print)
{
    int nibble;
    char nibbles = nibbles_to_print;
    if ((unsigned)nibbles > (2 * sizeof(number)))
        nibbles = 2 * sizeof(number);

    while (nibbles > 0)
    {
        nibbles--;
        nibble = (int)(number >> (nibbles * 4)) & 0x0F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}